

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZGeoElSidePartition>::TPZVec
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  undefined8 *puVar1;
  TPZGeoElSidePartition *pTVar2;
  TPZGeoElSidePartition *pTVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_018f93b0;
  this->fStore = (TPZGeoElSidePartition *)0x0;
  uVar10 = copy->fNElements;
  if (0 < (long)uVar10) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    uVar5 = SUB168(auVar4 * ZEXT816(0x38),0);
    uVar6 = uVar5 + 8;
    if (0xfffffffffffffff7 < uVar5) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
      uVar5 = uVar6;
    }
    puVar7 = (ulong *)operator_new__(uVar5);
    *puVar7 = uVar10;
    lVar8 = 0;
    do {
      *(undefined ***)((long)puVar7 + lVar8 + 8) = &PTR__TPZGeoElSide_018f8760;
      *(undefined8 *)((long)puVar7 + lVar8 + 0x10) = 0;
      *(undefined4 *)((long)puVar7 + lVar8 + 0x18) = 0xffffffff;
      *(undefined ***)((long)puVar7 + lVar8 + 0x20) = &PTR__TPZVec_018f93b0;
      puVar1 = (undefined8 *)((long)puVar7 + lVar8 + 0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar7 + lVar8 + 0x38) = 0;
      lVar8 = lVar8 + 0x38;
    } while (uVar10 * 0x38 - lVar8 != 0);
    this->fStore = (TPZGeoElSidePartition *)(puVar7 + 1);
    if (0 < (long)uVar10) {
      lVar8 = 0x18;
      lVar9 = 0;
      do {
        pTVar2 = copy->fStore;
        pTVar3 = this->fStore;
        *(undefined4 *)((long)pTVar3 + lVar8 + -8) = *(undefined4 *)((long)pTVar2 + lVar8 + -8);
        *(undefined8 *)((long)pTVar3 + lVar8 + -0x10) =
             *(undefined8 *)((long)pTVar2 + lVar8 + -0x10);
        operator=((TPZVec<TPZGeoElSidePartition> *)
                  ((long)&(pTVar3->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar8),
                  (TPZVec<TPZGeoElSidePartition> *)
                  ((long)&(pTVar2->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar8));
        lVar9 = lVar9 + 1;
        uVar10 = copy->fNElements;
        lVar8 = lVar8 + 0x38;
      } while (lVar9 < (long)uVar10);
    }
  }
  this->fNElements = uVar10;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}